

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O1

int la_adsc_nack_parse(void *dest,uint8_t *buf,uint32_t len)

{
  uint8_t *__ptr;
  int iVar1;
  
  if (len < 2) {
    return -1;
  }
  __ptr = (uint8_t *)
          la_xcalloc(1,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/adsc.c"
                     ,0x1b9,"la_adsc_nack_parse");
  *__ptr = *buf;
  if (buf[1] < 0xe) {
    __ptr[1] = buf[1];
    iVar1 = 2;
    if ((buf[1] < 8) && ((0x86U >> (buf[1] & 0x1f) & 1) != 0)) {
      if (len == 2) goto LAB_0014f5e8;
      __ptr[2] = buf[2];
      iVar1 = 3;
    }
    *(uint8_t **)((long)dest + 0x10) = __ptr;
  }
  else {
LAB_0014f5e8:
    free(__ptr);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

LA_ADSC_PARSER_FUN(la_adsc_nack_parse) {
	uint32_t tag_len = 2;
	la_adsc_tag_t *t = dest;
	LA_ADSC_CHECK_LEN(t->tag, len, tag_len);
	LA_NEW(la_adsc_nack_t, n);

	n->contract_req_num = buf[0];
	if(buf[1] > LA_ADSC_NACK_MAX_REASON_CODE) {
		la_debug_print(D_ERROR, "Invalid reason code: %u\n", buf[1]);
		goto fail;
	}
	n->reason = buf[1];
	la_debug_print(D_INFO, "reason: %u\n", n->reason);

	// these reason codes have extended data byte
	if(buf[1] == 1 || buf[1] == 2 || buf[1] == 7) {
		tag_len++;
		if(len < tag_len) {
			la_debug_print(D_ERROR, "Truncated tag %u: len: %u < %u\n", t->tag, len, tag_len);
			goto fail;
		}
		n->ext_data = buf[2];
		la_debug_print(D_INFO, "ext_data: %u\n", n->ext_data);
	}
	t->data = n;
	return tag_len;
fail:
	LA_XFREE(n);
	return -1;
}